

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<Fad<long_double>_>::Multiply
          (TPZMatrix<Fad<long_double>_> *this,TPZFMatrix<Fad<long_double>_> *A,
          TPZFMatrix<Fad<long_double>_> *B,int opt)

{
  int64_t iVar1;
  int64_t iVar2;
  ostream *poVar3;
  int in_ECX;
  Fad<long_double> *in_RDX;
  TPZBaseMatrix *in_RSI;
  TPZBaseMatrix *in_RDI;
  size_t in_stack_000002f8;
  char *in_stack_00000300;
  Fad<long_double> *in_stack_fffffffffffffee0;
  Fad<long_double> *pFVar4;
  undefined1 local_98 [8];
  TPZFMatrix<Fad<long_double>_> *in_stack_ffffffffffffff70;
  TPZFMatrix<Fad<long_double>_> *in_stack_ffffffffffffff78;
  undefined1 local_58 [60];
  int local_1c;
  Fad<long_double> *local_18;
  TPZBaseMatrix *local_10;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (in_ECX == 0) {
    iVar1 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RDX);
    iVar2 = TPZBaseMatrix::Rows(in_RDI);
    if (iVar1 == iVar2) {
      iVar1 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_18);
      iVar2 = TPZBaseMatrix::Cols(local_10);
      if (iVar1 == iVar2) goto LAB_0133f9e7;
    }
    pFVar4 = local_18;
    iVar1 = TPZBaseMatrix::Rows(in_RDI);
    iVar2 = TPZBaseMatrix::Cols(local_10);
    (*((TPZSavable *)&pFVar4->val_)->_vptr_TPZSavable[0xe])(pFVar4,iVar1,iVar2);
    goto LAB_0133fae7;
  }
LAB_0133f9e7:
  if (local_1c == 0) {
LAB_0133fa88:
    if ((local_1c != 0) && (in_RDI->fDecomposed != '\0')) {
      std::operator<<((ostream *)&std::cerr,
                      "virtual void TPZMatrix<Fad<long double>>::Multiply(const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, int) const [T = Fad<long double>]"
                     );
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "\nERROR: Cannot multiply with opt when matrix is decomposed");
      std::operator<<(poVar3,"\nAborting...\n");
      pzinternal::DebugStopImpl(in_stack_00000300,in_stack_000002f8);
    }
  }
  else {
    iVar1 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_18);
    iVar2 = TPZBaseMatrix::Cols(in_RDI);
    if (iVar1 == iVar2) {
      iVar1 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_18);
      iVar2 = TPZBaseMatrix::Cols(local_10);
      if (iVar1 == iVar2) goto LAB_0133fa88;
    }
    pFVar4 = local_18;
    iVar1 = TPZBaseMatrix::Cols(in_RDI);
    iVar2 = TPZBaseMatrix::Cols(local_10);
    (*((TPZSavable *)&pFVar4->val_)->_vptr_TPZSavable[0xe])(pFVar4,iVar1,iVar2);
  }
LAB_0133fae7:
  switch(in_RDI->fDecomposed) {
  case '\0':
    pFVar4 = local_18;
    Fad<long_double>::Fad<double,_nullptr>(local_18,(double *)local_10);
    Fad<long_double>::Fad<double,_nullptr>(pFVar4,(double *)local_10);
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x27])
              (in_RDI,local_10,local_18,pFVar4,local_58,local_98,local_1c);
    Fad<long_double>::~Fad(in_stack_fffffffffffffee0);
    Fad<long_double>::~Fad(in_stack_fffffffffffffee0);
    break;
  case '\x01':
    TPZFMatrix<Fad<long_double>_>::operator=(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x43])(in_RDI,local_18);
    break;
  default:
    std::operator<<((ostream *)&std::cerr,
                    "virtual void TPZMatrix<Fad<long double>>::Multiply(const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, int) const [T = Fad<long double>]"
                   );
    poVar3 = std::operator<<((ostream *)&std::cerr,"\nERROR: Cannot multiply with fDecomposed:");
    poVar3 = std::operator<<(poVar3,in_RDI->fDecomposed);
    std::operator<<(poVar3,"\nAborting...\n");
    pzinternal::DebugStopImpl(in_stack_00000300,in_stack_000002f8);
    break;
  case '\x03':
    TPZFMatrix<Fad<long_double>_>::operator=(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x44])(in_RDI,local_18);
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x45])(in_RDI,local_18);
    break;
  case '\x04':
    TPZFMatrix<Fad<long_double>_>::operator=(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x46])(in_RDI,local_18);
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x48])(in_RDI,local_18);
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x47])(in_RDI,local_18);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Multiply(const TPZFMatrix<TVar> &A, TPZFMatrix<TVar>&B, int opt) const {
  
	
	if(!opt && (B.Rows() != Rows() || B.Cols() != A.Cols())) {
		B.Redim(Rows(),A.Cols());
	}
	else if (opt && (B.Rows() != Cols() || B.Cols() != A.Cols())) {
		B.Redim(Cols(),A.Cols());
	}else if(opt && this->fDecomposed){
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"\nERROR: Cannot multiply with opt when matrix is decomposed"
           <<"\nAborting...\n";
    DebugStop();
  }
  
  switch(this->fDecomposed){
  case ENoDecompose:
    MultAdd( A, B, B, 1.0, 0.0, opt);
    break;
  case ELU:
    B=A;
    Substitution(&B);
    break;
  case ECholesky:
    B=A;
    Subst_Forward(&B);
    Subst_Backward(&B);
    break;
  case ELDLt:
    B=A;
    Subst_LForward(&B);
    Subst_Diag(&B);
    Subst_LBackward(&B);
    break;
  default:
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"\nERROR: Cannot multiply with fDecomposed:"<<fDecomposed
           <<"\nAborting...\n";
    DebugStop();
  }
	
}